

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::ungrabMouse(QGraphicsScenePrivate *this,QGraphicsItem *item,bool itemIsDying)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qsizetype qVar4;
  QGraphicsItem **ppQVar5;
  QGraphicsWidget **ppQVar6;
  undefined1 in_DL;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *last;
  int index;
  QEvent event_1;
  QEvent event;
  QList<QGraphicsWidget_*> *in_stack_ffffffffffffff68;
  QGraphicsItem *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  QMessageLogger *in_stack_ffffffffffffff80;
  QGraphicsItem *pQVar7;
  QGraphicsItem *event_00;
  QGraphicsScenePrivate *in_stack_ffffffffffffff98;
  QGraphicsScenePrivate *this_00;
  undefined3 in_stack_ffffffffffffffa4;
  uint uVar8;
  undefined1 *local_50;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 itemIsDying_00;
  QGraphicsScenePrivate *in_stack_ffffffffffffffc0;
  QGraphicsWidget *in_stack_ffffffffffffffd0;
  QGraphicsItem *in_stack_ffffffffffffffe8;
  
  itemIsDying_00 = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = CONCAT13(in_DL,in_stack_ffffffffffffffa4) & 0x1ffffff;
  qVar4 = QListSpecialMethodsBase<QGraphicsItem*>::indexOf<QGraphicsItem*>
                    ((QListSpecialMethodsBase<QGraphicsItem_*> *)in_stack_ffffffffffffff70,
                     (QGraphicsItem **)in_stack_ffffffffffffff68,0x9c4b73);
  iVar3 = (int)qVar4;
  if (iVar3 == -1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(char *)in_stack_ffffffffffffff68);
    QMessageLogger::warning
              (&stack0xffffffffffffffd0,"QGraphicsItem::ungrabMouse: not a mouse grabber");
  }
  else {
    event_00 = in_RSI;
    ppQVar5 = QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff68)
    ;
    if (event_00 != *ppQVar5) {
      QList<QGraphicsItem_*>::at
                ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff70,
                 (qsizetype)in_stack_ffffffffffffff68);
      ungrabMouse((QGraphicsScenePrivate *)CONCAT44(uVar8,iVar3),in_stack_ffffffffffffffe8,
                  SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
    }
    bVar2 = QList<QGraphicsWidget_*>::isEmpty((QList<QGraphicsWidget_*> *)0x9c4c16);
    if (!bVar2) {
      ppQVar6 = QList<QGraphicsWidget_*>::constLast(in_stack_ffffffffffffff68);
      pQVar7 = (QGraphicsItem *)0x0;
      if (*ppQVar6 != (QGraphicsWidget *)0x0) {
        pQVar7 = &((*ppQVar6)->super_QGraphicsObject).super_QGraphicsItem;
      }
      in_stack_ffffffffffffff70 = in_RSI;
      if (in_RSI == pQVar7) {
        QList<QGraphicsWidget_*>::constLast(in_stack_ffffffffffffff68);
        removePopup(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffd0,(bool)itemIsDying_00);
        goto LAB_009c4d8a;
      }
    }
    if ((uVar8 & 0x1000000) == 0) {
      QEvent::QEvent((QEvent *)&stack0xffffffffffffffc0,UngrabMouse);
      sendEvent(in_stack_ffffffffffffff98,in_RDI,(QEvent *)event_00);
      QEvent::~QEvent((QEvent *)&stack0xffffffffffffffc0);
    }
    QList<QGraphicsItem_*>::takeLast((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff70);
    *(uint *)&in_RDI[0xb].d_ptr.d = *(uint *)&in_RDI[0xb].d_ptr.d & 0xfffff7ff;
    if ((uVar8 & 0x1000000) == 0) {
      bVar2 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c4d28);
      if (!bVar2) {
        ppQVar5 = QList<QGraphicsItem_*>::constLast
                            ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff68);
        this_00 = (QGraphicsScenePrivate *)*ppQVar5;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_50,GrabMouse);
        sendEvent(this_00,in_RDI,(QEvent *)event_00);
        QEvent::~QEvent((QEvent *)&local_50);
      }
    }
  }
LAB_009c4d8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::ungrabMouse(QGraphicsItem *item, bool itemIsDying)
{
    int index = mouseGrabberItems.indexOf(item);
    if (index == -1) {
        qWarning("QGraphicsItem::ungrabMouse: not a mouse grabber");
        return;
    }

    if (item != mouseGrabberItems.constLast()) {
        // Recursively ungrab the next mouse grabber until we reach this item
        // to ensure state consistency.
        ungrabMouse(mouseGrabberItems.at(index + 1), itemIsDying);
    }
    if (!popupWidgets.isEmpty() && item == popupWidgets.constLast()) {
        // If the item is a popup, go via removePopup to ensure state
        // consistency and that it gets hidden correctly - beware that
        // removePopup() reenters this function to continue removing the grab.
        removePopup(popupWidgets.constLast(), itemIsDying);
        return;
    }

    // Send notification about mouse ungrab.
    if (!itemIsDying) {
        QEvent event(QEvent::UngrabMouse);
        sendEvent(item, &event);
    }

    // Remove the item from the list of grabbers. Whenever this happens, we
    // reset the implicitGrab (there can be only ever be one implicit grabber
    // in a scene, and it is always the latest grabber; if the implicit grab
    // is lost, it is not automatically regained.
    mouseGrabberItems.takeLast();
    lastMouseGrabberItemHasImplicitMouseGrab = false;

    // Send notification about mouse regrab. ### It's unfortunate that all the
    // items get a GrabMouse event, but this is a rare case with a simple
    // implementation and it does ensure a consistent state.
    if (!itemIsDying && !mouseGrabberItems.isEmpty()) {
        QGraphicsItem *last = mouseGrabberItems.constLast();
        QEvent event(QEvent::GrabMouse);
        sendEvent(last, &event);
    }
}